

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O2

void __thiscall Commodore::C1540::SerialPortVIA::update_data_line(SerialPortVIA *this)

{
  shared_ptr<Commodore::Serial::Port> serialPort;
  
  std::__shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&serialPort.super___shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>,
             &this->serial_port_);
  if (serialPort.super___shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    Serial::Port::set_output
              (serialPort.super___shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,Data,
               ~this->data_level_output_ &
               this->attention_level_input_ != this->attention_acknowledge_level_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&serialPort.super___shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SerialPortVIA::update_data_line() {
	std::shared_ptr<::Commodore::Serial::Port> serialPort = serial_port_.lock();
	if(serialPort) {
		// "ATN (Attention) is an input on pin 3 of P2 and P3 that is sensed at PB7 and CA1 of UC3 after being inverted by UA1"
		serialPort->set_output(::Commodore::Serial::Line::Data,
			::Commodore::Serial::LineLevel(!data_level_output_ && (attention_level_input_ != attention_acknowledge_level_)));
	}
}